

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O0

void inner_update_proximal(update_data *d,float x,float *wref)

{
  uchar *in_RCX;
  size_t *siglen;
  float *in_RSI;
  float *sig;
  EVP_PKEY_CTX *in_RDI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  float in_XMM0_Da;
  float fVar1;
  float __x;
  float fVar2;
  float fVar3;
  float extraout_XMM0_Da;
  float step;
  float fabs_zt;
  float flag;
  float sigma;
  float sqrt_wW_G2;
  float sqrt_ng2;
  float ng2;
  float gradient;
  float *w;
  
  fVar1 = *(float *)in_RDI * in_XMM0_Da;
  __x = fVar1 * fVar1 + in_RSI[2];
  sig = in_RSI;
  ctx = in_RDI;
  fVar2 = sqrtf(__x);
  fVar3 = sqrtf(in_RSI[2]);
  in_RSI[1] = -((fVar2 - fVar3) / *(float *)(in_RDI + 4)) * *in_RSI + fVar1 + in_RSI[1];
  in_RSI[2] = __x;
  sign(ctx,(uchar *)sig,siglen,in_RCX,in_R8);
  if (*(float *)(in_RDI + 0xc) < in_RSI[1] * extraout_XMM0_Da) {
    *in_RSI = (1.0 / (*(float *)(in_RDI + 0x10) +
                     (*(float *)(in_RDI + 8) + fVar2) / *(float *)(in_RDI + 4))) * extraout_XMM0_Da
              * (*(float *)(in_RDI + 0xc) - in_RSI[1] * extraout_XMM0_Da);
  }
  else {
    *in_RSI = 0.0;
  }
  return;
}

Assistant:

void inner_update_proximal(update_data& d, float x, float& wref)
{
  float* w = &wref;
  float gradient = d.update * x;
  float ng2 = w[W_G2] + gradient * gradient;
  float sqrt_ng2 = sqrtf(ng2);
  float sqrt_wW_G2 = sqrtf(w[W_G2]);
  float sigma = (sqrt_ng2 - sqrt_wW_G2) / d.ftrl_alpha;
  w[W_ZT] += gradient - sigma * w[W_XT];
  w[W_G2] = ng2;
  sqrt_wW_G2 = sqrt_ng2;
  float flag = sign(w[W_ZT]);
  float fabs_zt = w[W_ZT] * flag;
  if (fabs_zt <= d.l1_lambda)
    w[W_XT] = 0.;
  else
  {
    float step = 1 / (d.l2_lambda + (d.ftrl_beta + sqrt_wW_G2) / d.ftrl_alpha);
    w[W_XT] = step * flag * (d.l1_lambda - fabs_zt);
  }
}